

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O3

int32_t utrace_vformat_63(char *outBuf,int32_t capacity,int32_t indent,char *fmt,__va_list_tag *args
                         )

{
  char cVar1;
  byte c;
  uint uVar2;
  int32_t iVar3;
  ulong *puVar4;
  int iVar5;
  int32_t *piVar6;
  int *piVar7;
  ulong *puVar8;
  undefined8 *puVar9;
  ulong uVar10;
  UChar *s;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  uint local_90;
  int32_t local_8c;
  ulong *local_88;
  char *local_80;
  int local_74;
  ulong local_70;
  __va_list_tag *local_68;
  long local_60;
  ulong *local_58;
  ulong local_50;
  ulong *local_48;
  ulong *local_40;
  ulong *local_38;
  
  local_90 = 0;
  local_70 = 0;
  iVar5 = 0;
  local_8c = indent;
  local_80 = fmt;
  local_68 = args;
LAB_0030490a:
  while( true ) {
    iVar14 = iVar5 + 3;
    pcVar16 = fmt + iVar5;
    lVar12 = (long)iVar5 << 0x20;
    while( true ) {
      fmt = local_80;
      iVar3 = local_8c;
      lVar12 = lVar12 + 0x100000000;
      cVar1 = *pcVar16;
      if (cVar1 == '%') break;
      outputChar(cVar1,outBuf,(int32_t *)&local_90,capacity,local_8c);
      iVar14 = iVar14 + 1;
      pcVar16 = pcVar16 + 1;
      if (cVar1 == '\0') {
        uVar10 = (ulong)local_90;
        if (local_90 == 0) {
          if (local_8c < 1) {
            uVar10 = 0;
          }
          else {
            uVar10 = 0;
            do {
              if ((int)uVar10 < capacity) {
                outBuf[uVar10] = ' ';
              }
              uVar10 = uVar10 + 1;
            } while (local_8c != (int)uVar10);
          }
        }
        iVar5 = (int)uVar10;
        if (iVar5 < capacity) {
          outBuf[iVar5] = '\0';
        }
        return iVar5 + 1;
      }
    }
    iVar5 = iVar14 + -1;
    c = local_80[lVar12 >> 0x20];
    if (0x61 < c) break;
    if (c == 0) {
      outputChar('%',outBuf,(int32_t *)&local_90,capacity,local_8c);
      fmt = local_80;
      iVar5 = iVar14 + -2;
    }
    else if (c == 0x53) {
      uVar2 = local_68->gp_offset;
      uVar10 = (ulong)uVar2;
      if (uVar10 < 0x29) {
        local_68->gp_offset = (uint)(uVar10 + 8);
        s = *(UChar **)((long)local_68->reg_save_area + uVar10);
        if (0x20 < uVar2) goto LAB_00304d7f;
        piVar6 = (int32_t *)(uVar10 + 8 + (long)local_68->reg_save_area);
        local_68->gp_offset = uVar2 + 0x10;
      }
      else {
        puVar9 = (undefined8 *)local_68->overflow_arg_area;
        local_68->overflow_arg_area = puVar9 + 1;
        s = (UChar *)*puVar9;
LAB_00304d7f:
        piVar6 = (int32_t *)local_68->overflow_arg_area;
        local_68->overflow_arg_area = piVar6 + 2;
      }
      outputUString(s,*piVar6,outBuf,(int32_t *)&local_90,capacity,local_8c);
      fmt = local_80;
    }
    else {
switchD_00304997_caseD_65:
      outputChar(c,outBuf,(int32_t *)&local_90,capacity,local_8c);
      fmt = local_80;
    }
  }
  switch(c) {
  case 0x62:
    uVar2 = local_68->gp_offset;
    local_88 = (ulong *)CONCAT44(local_88._4_4_,iVar5);
    if ((ulong)uVar2 < 0x29) {
      piVar7 = (int *)((ulong)uVar2 + (long)local_68->reg_save_area);
      local_68->gp_offset = uVar2 + 8;
    }
    else {
      piVar7 = (int *)local_68->overflow_arg_area;
      local_68->overflow_arg_area = piVar7 + 2;
    }
    iVar5 = *piVar7;
    lVar12 = 4;
    do {
      outputChar("0123456789abcdef"[(uint)((long)iVar5 >> ((byte)lVar12 & 0x3f)) & 0xf],outBuf,
                 (int32_t *)&local_90,capacity,0);
      lVar12 = lVar12 + -4;
      uVar10 = local_70;
    } while (lVar12 != -4);
    break;
  case 99:
    uVar2 = local_68->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      pcVar16 = (char *)((ulong)uVar2 + (long)local_68->reg_save_area);
      local_68->gp_offset = uVar2 + 8;
    }
    else {
      pcVar16 = (char *)local_68->overflow_arg_area;
      local_68->overflow_arg_area = pcVar16 + 8;
    }
    outputChar(*pcVar16,outBuf,(int32_t *)&local_90,capacity,local_8c);
    fmt = local_80;
    goto LAB_0030490a;
  case 100:
    uVar2 = local_68->gp_offset;
    local_88 = (ulong *)CONCAT44(local_88._4_4_,iVar5);
    if ((ulong)uVar2 < 0x29) {
      piVar7 = (int *)((ulong)uVar2 + (long)local_68->reg_save_area);
      local_68->gp_offset = uVar2 + 8;
    }
    else {
      piVar7 = (int *)local_68->overflow_arg_area;
      local_68->overflow_arg_area = piVar7 + 2;
    }
    iVar5 = *piVar7;
    lVar12 = 0x1c;
    do {
      outputChar("0123456789abcdef"[(uint)((long)iVar5 >> ((byte)lVar12 & 0x3f)) & 0xf],outBuf,
                 (int32_t *)&local_90,capacity,0);
      lVar12 = lVar12 + -4;
      uVar10 = local_70;
    } while (lVar12 != -4);
    break;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
    goto switchD_00304997_caseD_65;
  case 0x68:
    uVar2 = local_68->gp_offset;
    local_88 = (ulong *)CONCAT44(local_88._4_4_,iVar5);
    if ((ulong)uVar2 < 0x29) {
      piVar7 = (int *)((ulong)uVar2 + (long)local_68->reg_save_area);
      local_68->gp_offset = uVar2 + 8;
    }
    else {
      piVar7 = (int *)local_68->overflow_arg_area;
      local_68->overflow_arg_area = piVar7 + 2;
    }
    iVar5 = *piVar7;
    lVar12 = 0xc;
    do {
      outputChar("0123456789abcdef"[(uint)((long)iVar5 >> ((byte)lVar12 & 0x3f)) & 0xf],outBuf,
                 (int32_t *)&local_90,capacity,0);
      lVar12 = lVar12 + -4;
      uVar10 = local_70;
    } while (lVar12 != -4);
    break;
  case 0x6c:
    uVar2 = local_68->gp_offset;
    local_88 = (ulong *)CONCAT44(local_88._4_4_,iVar5);
    if ((ulong)uVar2 < 0x29) {
      puVar8 = (ulong *)((ulong)uVar2 + (long)local_68->reg_save_area);
      local_68->gp_offset = uVar2 + 8;
    }
    else {
      puVar8 = (ulong *)local_68->overflow_arg_area;
      local_68->overflow_arg_area = puVar8 + 1;
    }
    uVar10 = *puVar8;
    lVar12 = 0x3c;
    do {
      outputChar("0123456789abcdef"[(uint)((long)uVar10 >> ((byte)lVar12 & 0x3f)) & 0xf],outBuf,
                 (int32_t *)&local_90,capacity,0);
      lVar12 = lVar12 + -4;
    } while (lVar12 != -4);
    break;
  case 0x70:
    uVar2 = local_68->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar9 = (undefined8 *)((ulong)uVar2 + (long)local_68->reg_save_area);
      local_68->gp_offset = uVar2 + 8;
    }
    else {
      puVar9 = (undefined8 *)local_68->overflow_arg_area;
      local_68->overflow_arg_area = puVar9 + 1;
    }
    outputPtrBytes((void *)*puVar9,outBuf,(int32_t *)&local_90,capacity);
    goto LAB_0030490a;
  default:
    if (c == 0x73) {
      uVar2 = local_68->gp_offset;
      local_88 = (ulong *)CONCAT44(local_88._4_4_,iVar5);
      if ((ulong)uVar2 < 0x29) {
        puVar9 = (undefined8 *)((ulong)uVar2 + (long)local_68->reg_save_area);
        local_68->gp_offset = uVar2 + 8;
      }
      else {
        puVar9 = (undefined8 *)local_68->overflow_arg_area;
        local_68->overflow_arg_area = puVar9 + 1;
      }
      pcVar16 = (char *)*puVar9;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = "*NULL*";
      }
      do {
        cVar1 = *pcVar16;
        outputChar(cVar1,outBuf,(int32_t *)&local_90,capacity,iVar3);
        pcVar16 = pcVar16 + 1;
      } while (cVar1 != '\0');
      fmt = local_80;
      iVar5 = (int)local_88;
    }
    else {
      if (c != 0x76) goto switchD_00304997_caseD_65;
      uVar10 = (ulong)(byte)local_80[iVar5];
      if (local_80[iVar5] == 0) {
        iVar14 = iVar5;
      }
      iVar5 = iVar14;
      uVar2 = local_68->gp_offset;
      uVar11 = (ulong)uVar2;
      if (uVar11 < 0x29) {
        local_68->gp_offset = (uint)(uVar11 + 8);
        local_88 = *(ulong **)((long)local_68->reg_save_area + uVar11);
        if (0x20 < uVar2) goto LAB_00304dbe;
        piVar7 = (int *)(uVar11 + 8 + (long)local_68->reg_save_area);
        local_68->gp_offset = uVar2 + 0x10;
      }
      else {
        puVar9 = (undefined8 *)local_68->overflow_arg_area;
        local_68->overflow_arg_area = puVar9 + 1;
        local_88 = (ulong *)*puVar9;
LAB_00304dbe:
        piVar7 = (int *)local_68->overflow_arg_area;
        local_68->overflow_arg_area = piVar7 + 2;
      }
      iVar14 = *piVar7;
      lVar12 = (long)iVar14;
      if (local_88 == (ulong *)0x0) {
        lVar13 = 0;
        local_60 = lVar12;
        do {
          pcVar16 = "*NULL* " + lVar13;
          lVar13 = lVar13 + 1;
          outputChar(*pcVar16,outBuf,(int32_t *)&local_90,capacity,iVar3);
          uVar11 = local_70;
          lVar12 = local_60;
        } while (lVar13 != 8);
      }
      else {
        uVar11 = local_70;
        if (iVar14 == -1 || 0 < iVar14) {
          iVar14 = 0;
          local_74 = 0;
          local_38 = local_88;
          local_40 = local_88;
          local_48 = local_88;
          local_58 = local_88;
          local_60 = lVar12;
          local_50 = uVar10;
          do {
            puVar4 = local_58;
            puVar8 = local_88;
            iVar3 = local_8c;
            iVar15 = (int)uVar10;
            switch(iVar15) {
            case 0x62:
              uVar11 = (ulong)(char)*local_58;
              local_58 = (ulong *)((long)local_58 + 1);
              local_74 = 2;
              break;
            case 99:
              outputChar((char)*local_58,outBuf,(int32_t *)&local_90,capacity,local_8c);
              uVar11 = (ulong)(char)*puVar4;
              local_58 = (ulong *)((long)puVar4 + 1);
              lVar12 = local_60;
              goto LAB_0030505f;
            case 100:
              uVar11 = (ulong)(int)*local_40;
              local_40 = (ulong *)((long)local_40 + 4);
              local_74 = 8;
              break;
            case 0x65:
            case 0x66:
            case 0x67:
            case 0x69:
            case 0x6a:
            case 0x6b:
            case 0x6d:
            case 0x6e:
            case 0x6f:
switchD_00304e33_caseD_65:
              if (0 < local_74) break;
              goto LAB_00305067;
            case 0x68:
              uVar11 = (ulong)(short)*local_48;
              local_48 = (ulong *)((long)local_48 + 2);
              local_74 = 4;
              break;
            case 0x6c:
              uVar11 = *local_38;
              local_38 = local_38 + 1;
              local_74 = 0x10;
              break;
            case 0x70:
              local_70 = CONCAT44(local_70._4_4_,iVar14);
              outputPtrBytes((void *)*local_88,outBuf,(int32_t *)&local_90,capacity);
              uVar11 = (ulong)(*puVar8 != 0);
              local_88 = puVar8 + 1;
              iVar14 = (int)local_70;
              goto LAB_0030505f;
            default:
              if (iVar15 != 0x53) {
                if (iVar15 != 0x73) goto switchD_00304e33_caseD_65;
                local_70 = CONCAT44(local_70._4_4_,iVar14);
                pcVar16 = (char *)*local_88;
                if (pcVar16 == (char *)0x0) {
                  pcVar16 = "*NULL*";
                }
                do {
                  cVar1 = *pcVar16;
                  outputChar(cVar1,outBuf,(int32_t *)&local_90,capacity,iVar3);
                  pcVar16 = pcVar16 + 1;
                } while (cVar1 != '\0');
                outputChar('\n',outBuf,(int32_t *)&local_90,capacity,iVar3);
                uVar11 = (ulong)(*local_88 != 0);
                local_88 = local_88 + 1;
                local_74 = 0;
                uVar10 = local_50;
                lVar12 = local_60;
                iVar14 = (int)local_70;
                goto LAB_00305067;
              }
              local_70 = CONCAT44(local_70._4_4_,iVar14);
              outputUString((UChar *)*local_88,-1,outBuf,(int32_t *)&local_90,capacity,local_8c);
              iVar14 = (int)local_70;
              outputChar('\n',outBuf,(int32_t *)&local_90,capacity,iVar3);
              uVar11 = (ulong)(*local_88 != 0);
              local_88 = local_88 + 1;
              uVar10 = local_50;
LAB_0030505f:
              local_74 = 0;
              goto LAB_00305067;
            }
            outputHexBytes(uVar11,local_74,outBuf,(int32_t *)&local_90,capacity);
            outputChar(' ',outBuf,(int32_t *)&local_90,capacity,local_8c);
            uVar10 = local_50;
            lVar12 = local_60;
LAB_00305067:
            iVar15 = (int)lVar12;
            if ((iVar15 == -1) && (uVar11 == 0)) {
              uVar11 = 0;
              break;
            }
            iVar14 = iVar14 + 1;
          } while (iVar15 == -1 || iVar14 < iVar15);
        }
      }
      local_70 = uVar11;
      outputChar('[',outBuf,(int32_t *)&local_90,capacity,local_8c);
      lVar13 = 0x1c;
      do {
        outputChar("0123456789abcdef"[(uint)(lVar12 >> ((byte)lVar13 & 0x3f)) & 0xf],outBuf,
                   (int32_t *)&local_90,capacity,0);
        lVar13 = lVar13 + -4;
      } while (lVar13 != -4);
      outputChar(']',outBuf,(int32_t *)&local_90,capacity,local_8c);
      fmt = local_80;
    }
    goto LAB_0030490a;
  }
  local_70 = uVar10;
  fmt = local_80;
  iVar5 = (int)local_88;
  goto LAB_0030490a;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrace_vformat(char *outBuf, int32_t capacity, int32_t indent, const char *fmt, va_list args) {
    int32_t   outIx  = 0;
    int32_t   fmtIx  = 0;
    char      fmtC;
    char      c;
    int32_t   intArg;
    int64_t   longArg = 0;
    char      *ptrArg;

    /*   Loop runs once for each character in the format string.
     */
    for (;;) {
        fmtC = fmt[fmtIx++];
        if (fmtC != '%') {
            /* Literal character, not part of a %sequence.  Just copy it to the output. */
            outputChar(fmtC, outBuf, &outIx, capacity, indent);
            if (fmtC == 0) {
                /* We hit the null that terminates the format string.
                 * This is the normal (and only) exit from the loop that
                 * interprets the format
                 */
                break;
            }
            continue;
        }

        /* We encountered a '%'.  Pick up the following format char */
        fmtC = fmt[fmtIx++];

        switch (fmtC) {
        case 'c':
            /* single 8 bit char   */
            c = (char)va_arg(args, int32_t);
            outputChar(c, outBuf, &outIx, capacity, indent);
            break;

        case 's':
            /* char * string, null terminated.  */
            ptrArg = va_arg(args, char *);
            outputString((const char *)ptrArg, outBuf, &outIx, capacity, indent);
            break;

        case 'S':
            /* UChar * string, with length, len==-1 for null terminated. */
            ptrArg = va_arg(args, char *);             /* Ptr    */
            intArg =(int32_t)va_arg(args, int32_t);    /* Length */
            outputUString((const UChar *)ptrArg, intArg, outBuf, &outIx, capacity, indent);
            break;

        case 'b':
            /*  8 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 2, outBuf, &outIx, capacity);
            break;

        case 'h':
            /*  16 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 4, outBuf, &outIx, capacity);
            break;

        case 'd':
            /*  32 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 8, outBuf, &outIx, capacity);
            break;

        case 'l':
            /*  64 bit long  */
            longArg = va_arg(args, int64_t);
            outputHexBytes(longArg, 16, outBuf, &outIx, capacity);
            break;
            
        case 'p':
            /*  Pointers.   */
            ptrArg = va_arg(args, char *);
            outputPtrBytes(ptrArg, outBuf, &outIx, capacity);
            break;

        case 0:
            /* Single '%' at end of fmt string.  Output as literal '%'.   
             * Back up index into format string so that the terminating null will be
             * re-fetched in the outer loop, causing it to terminate.
             */
            outputChar('%', outBuf, &outIx, capacity, indent);
            fmtIx--;
            break;

        case 'v':
            {
                /* Vector of values, e.g. %vh */
                char     vectorType;
                int32_t  vectorLen;
                const char   *i8Ptr;
                int16_t  *i16Ptr;
                int32_t  *i32Ptr;
                int64_t  *i64Ptr;
                void     **ptrPtr;
                int32_t   charsToOutput = 0;
                int32_t   i;
                
                vectorType = fmt[fmtIx];    /* b, h, d, l, p, etc. */
                if (vectorType != 0) {
                    fmtIx++;
                }
                i8Ptr = (const char *)va_arg(args, void*);
                i16Ptr = (int16_t *)i8Ptr;
                i32Ptr = (int32_t *)i8Ptr;
                i64Ptr = (int64_t *)i8Ptr;
                ptrPtr = (void **)i8Ptr;
                vectorLen =(int32_t)va_arg(args, int32_t);
                if (ptrPtr == NULL) {
                    outputString("*NULL* ", outBuf, &outIx, capacity, indent);
                } else {
                    for (i=0; i<vectorLen || vectorLen==-1; i++) { 
                        switch (vectorType) {
                        case 'b':
                            charsToOutput = 2;
                            longArg = *i8Ptr++;
                            break;
                        case 'h':
                            charsToOutput = 4;
                            longArg = *i16Ptr++;
                            break;
                        case 'd':
                            charsToOutput = 8;
                            longArg = *i32Ptr++;
                            break;
                        case 'l':
                            charsToOutput = 16;
                            longArg = *i64Ptr++;
                            break;
                        case 'p':
                            charsToOutput = 0;
                            outputPtrBytes(*ptrPtr, outBuf, &outIx, capacity);
                            longArg = *ptrPtr==NULL? 0: 1;    /* test for null terminated array. */
                            ptrPtr++;
                            break;
                        case 'c':
                            charsToOutput = 0;
                            outputChar(*i8Ptr, outBuf, &outIx, capacity, indent);
                            longArg = *i8Ptr;    /* for test for null terminated array. */
                            i8Ptr++;
                            break;
                        case 's':
                            charsToOutput = 0;
                            outputString((const char *)*ptrPtr, outBuf, &outIx, capacity, indent);
                            outputChar('\n', outBuf, &outIx, capacity, indent);
                            longArg = *ptrPtr==NULL? 0: 1;   /* for test for null term. array. */
                            ptrPtr++;
                            break;

                        case 'S':
                            charsToOutput = 0;
                            outputUString((const UChar *)*ptrPtr, -1, outBuf, &outIx, capacity, indent);
                            outputChar('\n', outBuf, &outIx, capacity, indent);
                            longArg = *ptrPtr==NULL? 0: 1;   /* for test for null term. array. */
                            ptrPtr++;
                            break;

                            
                        }
                        if (charsToOutput > 0) {
                            outputHexBytes(longArg, charsToOutput, outBuf, &outIx, capacity);
                            outputChar(' ', outBuf, &outIx, capacity, indent);
                        }
                        if (vectorLen == -1 && longArg == 0) {
                            break;
                        }
                    }
                }
                outputChar('[', outBuf, &outIx, capacity, indent);
                outputHexBytes(vectorLen, 8, outBuf, &outIx, capacity);
                outputChar(']', outBuf, &outIx, capacity, indent);
            }
            break;


        default:
            /* %. in format string, where . is some character not in the set
             *    of recognized format chars.  Just output it as if % wasn't there.
             *    (Covers "%%" outputing a single '%')
             */
             outputChar(fmtC, outBuf, &outIx, capacity, indent);
        }
    }
    outputChar(0, outBuf, &outIx, capacity, indent);  /* Make sure that output is null terminated  */
    return outIx + 1;     /* outIx + 1 because outIx does not increment when outputing final null. */
}